

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int int32_encode(cram_fd *fd,int32_t val)

{
  ssize_t sVar1;
  undefined1 local_4 [4];
  
  sVar1 = hwrite(fd->fp,local_4,4);
  return (uint)(sVar1 == 4) * 5 + -1;
}

Assistant:

int int32_encode(cram_fd *fd, int32_t val) {
    val = le_int4(val);
    if (4 != hwrite(fd->fp, &val, 4))
	return -1;

    return 4;
}